

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verstring.c
# Opt level: O1

void ssh_verstring_free(BinaryPacketProtocol *bpp)

{
  conf_free(*(Conf **)&bpp[-1].in_pq.pqb.end.on_free_queue);
  safefree(bpp[-1].ic_in_raw.ctx);
  strbuf_free(*(strbuf **)&bpp[-1].ic_in_raw.queued);
  safefree(bpp[-1].ic_out_pq.fn);
  safefree(*(void **)&bpp[-1].ic_out_pq.queued);
  safefree(bpp[-1].in_pq.after);
  safefree(&bpp[-1].in_pq.pqb.end.formal_size);
  return;
}

Assistant:

void ssh_verstring_free(BinaryPacketProtocol *bpp)
{
    struct ssh_verstring_state *s =
        container_of(bpp, struct ssh_verstring_state, bpp);
    conf_free(s->conf);
    sfree(s->impl_name);
    strbuf_free(s->vstring);
    sfree(s->protoversion);
    sfree(s->our_vstring);
    sfree(s->our_protoversion);
    sfree(s);
}